

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::TriageCompareEdgeDistance<double>
              (Vector3<double> *x,Vector3<double> *a0,Vector3<double> *a1,double r2)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double n1;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  Vector3<double> local_58;
  double local_38;
  double dStack_30;
  
  dVar10 = a0->c_[0];
  dVar15 = a1->c_[0];
  dVar1 = x->c_[0];
  dVar16 = a1->c_[1];
  dVar17 = a1->c_[2];
  dVar7 = a0->c_[1];
  dVar8 = a0->c_[2];
  dStack_30 = dVar8 + dVar17;
  dVar6 = dVar10 - dVar1;
  local_58.c_[0] = (dVar7 - dVar16) * (dVar17 + dVar8) - (dVar8 - dVar17) * (dVar7 + dVar16);
  local_58.c_[1] = (dVar8 - dVar17) * (dVar15 + dVar10) - (dVar10 - dVar15) * (dVar17 + dVar8);
  local_58.c_[2] = (dVar7 + dVar16) * (dVar10 - dVar15) - (dVar15 + dVar10) * (dVar7 - dVar16);
  dVar10 = x->c_[1];
  dVar2 = x->c_[2];
  dVar12 = local_58.c_[1] * dVar2 - local_58.c_[2] * dVar10;
  dVar9 = dVar1 * local_58.c_[2] - dVar2 * local_58.c_[0];
  dVar11 = dVar10 * local_58.c_[0] - dVar1 * local_58.c_[1];
  dVar7 = dVar7 - dVar10;
  dVar8 = dVar8 - dVar2;
  local_38 = local_58.c_[2] * local_58.c_[2] +
             local_58.c_[1] * local_58.c_[1] + local_58.c_[0] * local_58.c_[0];
  n1 = SQRT(local_38);
  dVar14 = (n1 * 8.118802153517006 + 6.153480596427404e-15) * 1.1102230246251565e-16;
  dVar13 = dVar8 * dVar11 + dVar6 * dVar12 + 0.0 + dVar7 * dVar9;
  if (SQRT(dVar8 * dVar8 + dVar6 * dVar6 + dVar7 * dVar7) * dVar14 <= ABS(dVar13)) {
    dVar15 = dVar15 - dVar1;
    dVar16 = dVar16 - dVar10;
    dVar17 = dVar17 - dVar2;
    dVar10 = dVar11 * dVar17 + dVar12 * dVar15 + 0.0 + dVar9 * dVar16;
    if (dVar14 * SQRT(dVar17 * dVar17 + dVar15 * dVar15 + dVar16 * dVar16) <= ABS(dVar10)) {
      if ((dVar13 < 0.0) && (0.0 < dVar10)) {
        if (r2 < k45Degrees) {
          iVar3 = TriageCompareLineSin2Distance<double>(x,a0,a1,r2,&local_58,n1,local_38);
          return iVar3;
        }
        iVar3 = TriageCompareLineCos2Distance<double>(x,a0,a1,r2,&local_58,n1,local_38);
        return iVar3;
      }
      iVar3 = TriageCompareDistance<double>(x,a0,r2);
      iVar4 = TriageCompareDistance<double>(x,a1,r2);
      if (iVar4 < iVar3) {
        return iVar4;
      }
      return iVar3;
    }
  }
  iVar3 = TriageCompareDistance<double>(x,a0,r2);
  iVar4 = TriageCompareDistance<double>(x,a1,r2);
  if (iVar4 < iVar3) {
    iVar3 = iVar4;
  }
  if (k45Degrees <= r2) {
    iVar4 = TriageCompareLineCos2Distance<double>(x,a0,a1,r2,&local_58,n1,local_38);
  }
  else {
    iVar4 = TriageCompareLineSin2Distance<double>(x,a0,a1,r2,&local_58,n1,local_38);
  }
  iVar5 = 0;
  if (iVar3 == iVar4) {
    iVar5 = iVar4;
  }
  return iVar5;
}

Assistant:

int TriageCompareEdgeDistance(const Vector3<T>& x, const Vector3<T>& a0,
                              const Vector3<T>& a1, T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // First we need to decide whether the closest point is an edge endpoint or
  // somewhere in the interior.  To determine this we compute a plane
  // perpendicular to (a0, a1) that passes through X.  Letting M be the normal
  // to this plane, the closest point is in the edge interior if and only if
  // a0.M < 0 and a1.M > 0.  Note that we can use "<" rather than "<=" because
  // if a0.M or a1.M is zero exactly then it doesn't matter which code path we
  // follow (since the distance to an endpoint and the distance to the edge
  // interior are exactly the same in this case).
  Vector3<T> n = (a0 - a1).CrossProd(a0 + a1);
  Vector3<T> m = n.CrossProd(x);
  // For better accuracy when the edge (a0,a1) is very short, we subtract "x"
  // before computing the dot products with M.
  Vector3<T> a0_dir = a0 - x;
  Vector3<T> a1_dir = a1 - x;
  T a0_sign = a0_dir.DotProd(m);
  T a1_sign = a1_dir.DotProd(m);
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  T n1_error = ((3.5 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T a0_sign_error = n1_error * a0_dir.Norm();
  T a1_sign_error = n1_error * a1_dir.Norm();
  if (fabs(a0_sign) < a0_sign_error || fabs(a1_sign) < a1_sign_error) {
    // It is uncertain whether minimum distance is to an edge vertex or to the
    // edge interior.  We handle this by computing both distances and checking
    // whether they yield the same result.
    int vertex_sign = min(TriageCompareDistance(x, a0, r2),
                          TriageCompareDistance(x, a1, r2));
    int line_sign = TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
    return (vertex_sign == line_sign) ? line_sign : 0;
  }
  if (a0_sign >= 0 || a1_sign <= 0) {
    // The minimum distance is to an edge endpoint.
    return min(TriageCompareDistance(x, a0, r2),
               TriageCompareDistance(x, a1, r2));
  } else {
    // The minimum distance is to the edge interior.
    return TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
  }
}